

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<unsigned_short>::test_vectordivide_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_short> *this,unsigned_short denom,
          divider<unsigned_short,_(libdivide::Branching)0> *the_divider)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  size_t i;
  long lVar6;
  char mem [128];
  unsigned_short local_80 [40];
  
  lVar6 = 0;
  do {
    uVar1 = this->seed;
    uVar3 = (uint)this->rand_n;
    lVar4 = 0;
    do {
      uVar1 = uVar1 * 0x19660d + 0x3c6ef35f;
      uVar5 = uVar3 * (uVar1 & 1 | 2) + 3;
      uVar2 = (ushort)uVar3;
      uVar3 = uVar1 % 0x13;
      if (uVar2 <= (ushort)uVar5) {
        uVar3 = uVar5;
      }
      local_80[lVar4] = (UT)uVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    this->seed = uVar1;
    this->rand_n = (UT)uVar3;
    test_vec<long_long__vector(2),(libdivide::Branching)0>(this,local_80,0x20,denom,the_divider);
    test_vec<long_long__vector(4),(libdivide::Branching)0>(this,local_80,0x20,denom,the_divider);
    test_vec<long_long__vector(8),(libdivide::Branching)0>(this,local_80,0x20,denom,the_divider);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10000);
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }